

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_playground.cpp
# Opt level: O0

int main(void)

{
  int32_t iVar1;
  ostream *poVar2;
  size_t sVar3;
  size_type sVar4;
  outputs_type *this;
  string local_458;
  undefined1 local_438 [8];
  inputs_type inputs;
  bool all_ok;
  undefined1 local_408 [8];
  SM sm;
  
  sm._1012_4_ = 0;
  std::operator<<((ostream *)&std::cout,"--- state_machine playground ---\n");
  estl::state_machine<cd_fsm_def>::state_machine((state_machine<cd_fsm_def> *)local_408);
  poVar2 = std::operator<<((ostream *)&std::cout,"states_count() : ");
  sVar3 = estl::state_machine<cd_fsm_def>::states_count();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"current state  : ");
  iVar1 = estl::state_machine<cd_fsm_def>::state_int((state_machine<cd_fsm_def> *)local_408);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"tv1.size()      : ");
  sVar4 = std::
          vector<estl::state_machine<cd_fsm_def>::test_entry,_std::allocator<estl::state_machine<cd_fsm_def>::test_entry>_>
          ::size(&tv1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
  std::operator<<(poVar2,"\n");
  inputs.eject._3_1_ =
       estl::state_machine<cd_fsm_def>::test_transitions
                 ((state_machine<cd_fsm_def> *)local_408,&tv1,true);
  poVar2 = std::operator<<((ostream *)&std::cout,"sm.test_transitions(tv1):");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(inputs.eject._3_1_ & 1));
  std::operator<<(poVar2,"\n");
  cd_fsm_def::inputs_type::inputs_type((inputs_type *)local_438);
  estl::state_machine<cd_fsm_def>::state_set((state_machine<cd_fsm_def> *)local_408,closed);
  inputs.time.__d.__r._4_4_ = 1;
  estl::state_machine<cd_fsm_def>::execute_actions
            ((state_machine<cd_fsm_def> *)local_408,(inputs_type *)local_438);
  this = estl::state_machine<cd_fsm_def>::outputs((state_machine<cd_fsm_def> *)local_408);
  cd_fsm_def::outputs_type::debug_str_abi_cxx11_(&local_458,this);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_458);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_458);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  sm._1012_4_ = 0;
  estl::state_machine<cd_fsm_def>::~state_machine((state_machine<cd_fsm_def> *)local_408);
  return sm._1012_4_;
}

Assistant:

int main()
{
    cout << "--- state_machine playground ---\n";
    SM sm;
    cout << "states_count() : " << sm.states_count() << "\n";
    cout << "current state  : " << sm.state_int() << "\n";
    cout << "tv1.size()      : " << tv1.size() << "\n";
    const auto all_ok = sm.test_transitions(tv1, true);
    cout << "sm.test_transitions(tv1):" << all_ok << "\n";


    SM::inputs_type inputs;
    sm.state_set(state_type::closed);
    inputs.has_disc = has_disc_sig::active;
    sm.execute_actions(inputs);


    cout << sm.outputs().debug_str()
         << endl;

    cout << endl;
    return 0;
}